

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaCheckAttrUsePropsCorrect
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaAttributeUsePtr_conflict use)

{
  xmlSchemaValPtr *retVal;
  xmlSchemaTypePtr type;
  int iVar1;
  uint uVar2;
  int extraout_EAX;
  xmlSchemaAttributePtr in_RAX;
  xmlSchemaAttributePtr extraout_RAX;
  xmlSchemaAttributePtr extraout_RAX_00;
  char *pcVar3;
  xmlSchemaValPtr *str2;
  xmlChar *pxVar4;
  
  if ((((use == (xmlSchemaAttributeUsePtr_conflict)0x0) ||
       (pxVar4 = use->defValue, pxVar4 == (xmlChar *)0x0)) ||
      (in_RAX = use->attrDecl, in_RAX == (xmlSchemaAttributePtr)0x0)) ||
     (in_RAX->type != XML_SCHEMA_TYPE_ATTRIBUTE)) goto LAB_0019ef1b;
  if (((in_RAX->defValue == (xmlChar *)0x0) || ((in_RAX->flags & 0x200) == 0)) ||
     ((use->flags & 1) != 0)) {
    retVal = &use->defVal;
    if ((use->defVal != (xmlSchemaValPtr)0x0) &&
       (type = in_RAX->subtypes, type != (xmlSchemaTypePtr)0x0)) {
      iVar1 = xmlSchemaIsDerivedFromBuiltInType(type,(int)use);
      if (iVar1 == 0) {
        str2 = retVal;
        iVar1 = xmlSchemaVCheckCVCSimpleType
                          ((xmlSchemaAbstractCtxtPtr)ctxt,use->node,type,pxVar4,retVal,1,1,0);
        if (iVar1 == 0) goto LAB_0019eed0;
        if (iVar1 < 0) {
          xmlSchemaInternalErr2
                    ((xmlSchemaAbstractCtxtPtr)ctxt,"xmlSchemaCheckAttrUsePropsCorrect",
                     "calling xmlSchemaVCheckCVCSimpleType()",(xmlChar *)0x0,(xmlChar *)str2);
          return extraout_EAX;
        }
        pcVar3 = "The value of the value constraint is not valid";
      }
      else {
        pcVar3 = 
        "Value constraints are not allowed if the type definition is or is derived from xs:ID";
      }
      xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_AU_PROPS_CORRECT,
                          (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)use,pcVar3,(xmlChar *)0x0,
                          (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
      in_RAX = extraout_RAX;
      goto LAB_0019ef1b;
    }
LAB_0019eed0:
    in_RAX = use->attrDecl;
    if ((in_RAX->defVal == (xmlSchemaValPtr)0x0) || ((in_RAX->flags & 1) != 0)) goto LAB_0019ef1b;
    uVar2 = xmlSchemaAreValuesEqual(*retVal,in_RAX->defVal);
    in_RAX = (xmlSchemaAttributePtr)(ulong)uVar2;
    if (uVar2 != 0) goto LAB_0019ef1b;
    pxVar4 = use->attrDecl->defValue;
    pcVar3 = 
    "The \'fixed\' value constraint of the attribute use must match the attribute declaration\'s value constraint \'%s\'"
    ;
  }
  else {
    pcVar3 = 
    "The attribute declaration has a \'fixed\' value constraint , thus the attribute use must also have a \'fixed\' value constraint"
    ;
    pxVar4 = (xmlChar *)0x0;
  }
  xmlSchemaPCustomErrExt
            (ctxt,XML_SCHEMAP_AU_PROPS_CORRECT_2,(xmlSchemaBasicItemPtr)use,(xmlNodePtr)0x0,pcVar3,
             pxVar4,(xmlChar *)0x0,(xmlChar *)0x0);
  in_RAX = extraout_RAX_00;
LAB_0019ef1b:
  return (int)in_RAX;
}

Assistant:

static int
xmlSchemaCheckAttrUsePropsCorrect(xmlSchemaParserCtxtPtr ctxt,
			     xmlSchemaAttributeUsePtr use)
{
    if ((ctxt == NULL) || (use == NULL))
	return(-1);
    if ((use->defValue == NULL) || (WXS_ATTRUSE_DECL(use) == NULL) ||
	((WXS_ATTRUSE_DECL(use))->type != XML_SCHEMA_TYPE_ATTRIBUTE))
	return(0);

    /*
    * SPEC au-props-correct (1)
    * "The values of the properties of an attribute use must be as
    * described in the property tableau in The Attribute Use Schema
    * Component ($3.5.1), modulo the impact of Missing
    * Sub-components ($5.3)."
    */

    if (((WXS_ATTRUSE_DECL(use))->defValue != NULL) &&
	((WXS_ATTRUSE_DECL(use))->flags & XML_SCHEMAS_ATTR_FIXED) &&
        ((use->flags & XML_SCHEMA_ATTR_USE_FIXED) == 0))
    {
	xmlSchemaPCustomErr(ctxt,
	    XML_SCHEMAP_AU_PROPS_CORRECT_2,
	    WXS_BASIC_CAST use, NULL,
	    "The attribute declaration has a 'fixed' value constraint "
	    ", thus the attribute use must also have a 'fixed' value "
	    "constraint",
	    NULL);
	return(ctxt->err);
    }
    /*
    * Compute and check the value constraint's value.
    */
    if ((use->defVal != NULL) && (WXS_ATTRUSE_TYPEDEF(use) != NULL)) {
	int ret;
	/*
	* TODO: The spec seems to be missing a check of the
	* value constraint of the attribute use. We will do it here.
	*/
	/*
	* SPEC a-props-correct (3)
	*/
	if (xmlSchemaIsDerivedFromBuiltInType(
	    WXS_ATTRUSE_TYPEDEF(use), XML_SCHEMAS_ID))
	{
	    xmlSchemaCustomErr(ACTXT_CAST ctxt,
		XML_SCHEMAP_AU_PROPS_CORRECT,
		NULL, WXS_BASIC_CAST use,
		"Value constraints are not allowed if the type definition "
		"is or is derived from xs:ID",
		NULL, NULL);
	    return(ctxt->err);
	}

	ret = xmlSchemaVCheckCVCSimpleType(ACTXT_CAST ctxt,
	    use->node, WXS_ATTRUSE_TYPEDEF(use),
	    use->defValue, &(use->defVal),
	    1, 1, 0);
	if (ret != 0) {
	    if (ret < 0) {
		PERROR_INT2("xmlSchemaCheckAttrUsePropsCorrect",
		    "calling xmlSchemaVCheckCVCSimpleType()");
		return(-1);
	    }
	    xmlSchemaCustomErr(ACTXT_CAST ctxt,
		XML_SCHEMAP_AU_PROPS_CORRECT,
		NULL, WXS_BASIC_CAST use,
		"The value of the value constraint is not valid",
		NULL, NULL);
	    return(ctxt->err);
	}
    }
    /*
    * SPEC au-props-correct (2)
    * "If the {attribute declaration} has a fixed
    * {value constraint}, then if the attribute use itself has a
    * {value constraint}, it must also be fixed and its value must match
    * that of the {attribute declaration}'s {value constraint}."
    */
    if (((WXS_ATTRUSE_DECL(use))->defVal != NULL) &&
	(((WXS_ATTRUSE_DECL(use))->flags & XML_SCHEMA_ATTR_USE_FIXED) == 0))
    {
	if (! xmlSchemaAreValuesEqual(use->defVal,
		(WXS_ATTRUSE_DECL(use))->defVal))
	{
	    xmlSchemaPCustomErr(ctxt,
		XML_SCHEMAP_AU_PROPS_CORRECT_2,
		WXS_BASIC_CAST use, NULL,
		"The 'fixed' value constraint of the attribute use "
		"must match the attribute declaration's value "
		"constraint '%s'",
		(WXS_ATTRUSE_DECL(use))->defValue);
	}
	return(ctxt->err);
    }
    return(0);
}